

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_score.cc
# Opt level: O2

void __thiscall
xLearn::LinearScore::calc_grad_ftrl
          (LinearScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  float *pfVar5;
  undefined8 uVar6;
  bool bVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 in_register_00001244 [60];
  undefined1 auVar20 [64];
  
  auVar20._4_60_ = in_register_00001244;
  auVar20._0_4_ = norm;
  if (norm < 0.0) {
    fVar15 = sqrtf(norm);
  }
  else {
    auVar18 = vsqrtss_avx(auVar20._0_16_,auVar20._0_16_);
    fVar15 = auVar18._0_4_;
  }
  uVar2 = *(uint *)(model + 0x48);
  lVar4 = *(long *)(model + 0x58);
  for (lVar9 = *(long *)row; lVar9 != *(long *)(row + 8); lVar9 = lVar9 + 0xc) {
    uVar3 = *(uint *)(lVar9 + 4);
    if (uVar3 < uVar2) {
      uVar10 = (ulong)(uVar3 * 3);
      uVar11 = (ulong)(uVar3 * 3 + 1);
      fVar13 = *(float *)(lVar4 + uVar11 * 4);
      auVar17 = vfmadd231ss_fma(ZEXT416((uint)(pg * *(float *)(lVar9 + 8) * fVar15)),
                                ZEXT416((uint)(this->super_Score).lambda_2_),
                                ZEXT416(*(uint *)(lVar4 + uVar10 * 4)));
      auVar18 = vfmadd213ss_fma(auVar17,auVar17,ZEXT416((uint)fVar13));
      fVar12 = auVar18._0_4_;
      *(float *)(lVar4 + uVar11 * 4) = fVar12;
      if (fVar12 < 0.0) {
        fVar12 = sqrtf(fVar12);
      }
      else {
        auVar18 = vsqrtss_avx(auVar18,auVar18);
        fVar12 = auVar18._0_4_;
      }
      if (fVar13 < 0.0) {
        fVar13 = sqrtf(fVar13);
      }
      else {
        auVar18 = vsqrtss_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar13));
        fVar13 = auVar18._0_4_;
      }
      auVar16._0_4_ = (fVar12 - fVar13) / (this->super_Score).alpha_;
      auVar16._4_12_ = SUB6012((undefined1  [60])0x0,0);
      uVar8 = (ulong)(uVar3 * 3 + 2);
      auVar18 = vfnmadd231ss_fma(ZEXT416(auVar17._0_4_),auVar16,
                                 ZEXT416(*(uint *)(lVar4 + uVar10 * 4)));
      fVar12 = auVar18._0_4_ + *(float *)(lVar4 + uVar8 * 4);
      auVar17 = ZEXT816(0);
      uVar6 = vcmpss_avx512f(auVar17,ZEXT416((uint)fVar12),1);
      bVar7 = (bool)((byte)uVar6 & 1);
      *(float *)(lVar4 + uVar8 * 4) = fVar12;
      fVar13 = (this->super_Score).lambda_1_;
      fVar19 = (float)((uint)bVar7 * 0x3f800000 + (uint)!bVar7 * -0x40800000);
      if (fVar13 < fVar12 * fVar19) {
        fVar14 = *(float *)(lVar4 + uVar11 * 4);
        fVar1 = (this->super_Score).beta_;
        if (fVar14 < 0.0) {
          fVar14 = sqrtf(fVar14);
        }
        else {
          auVar18 = vsqrtss_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14));
          fVar14 = auVar18._0_4_;
        }
        auVar18 = vfmsub213ss_fma(ZEXT416((uint)fVar13),ZEXT416((uint)fVar19),ZEXT416((uint)fVar12))
        ;
        auVar17._0_4_ =
             auVar18._0_4_ /
             ((fVar1 + fVar14) / (this->super_Score).alpha_ + (this->super_Score).lambda_2_);
        auVar17._4_12_ = auVar18._4_12_;
      }
      *(int *)(lVar4 + uVar10 * 4) = auVar17._0_4_;
    }
  }
  pfVar5 = *(float **)(model + 0x68);
  fVar15 = pfVar5[1];
  auVar18 = vfmadd213ss_fma(ZEXT416((uint)pg),ZEXT416((uint)pg),ZEXT416((uint)fVar15));
  fVar13 = auVar18._0_4_;
  pfVar5[1] = fVar13;
  if (fVar13 < 0.0) {
    fVar13 = sqrtf(fVar13);
  }
  else {
    auVar18 = vsqrtss_avx(auVar18,auVar18);
    fVar13 = auVar18._0_4_;
  }
  if (fVar15 < 0.0) {
    fVar15 = sqrtf(fVar15);
  }
  else {
    auVar18 = vsqrtss_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15));
    fVar15 = auVar18._0_4_;
  }
  auVar18._0_4_ = (fVar13 - fVar15) / (this->super_Score).alpha_;
  auVar18._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar18 = vfnmadd231ss_fma(ZEXT416((uint)pg),auVar18,ZEXT416((uint)*pfVar5));
  fVar13 = auVar18._0_4_ + pfVar5[2];
  fVar19 = 0.0;
  uVar6 = vcmpss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)fVar13),1);
  bVar7 = (bool)((byte)uVar6 & 1);
  pfVar5[2] = fVar13;
  fVar15 = (this->super_Score).lambda_1_;
  fVar12 = (float)((uint)bVar7 * 0x3f800000 + (uint)!bVar7 * -0x40800000);
  if (fVar15 < fVar13 * fVar12) {
    auVar18 = vfmsub213ss_fma(ZEXT416((uint)fVar15),ZEXT416((uint)fVar12),ZEXT416((uint)fVar13));
    fVar15 = pfVar5[1];
    fVar13 = (this->super_Score).beta_;
    if (fVar15 < 0.0) {
      fVar15 = sqrtf(fVar15);
    }
    else {
      auVar17 = vsqrtss_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15));
      fVar15 = auVar17._0_4_;
    }
    fVar19 = auVar18._0_4_ /
             ((fVar13 + fVar15) / (this->super_Score).alpha_ + (this->super_Score).lambda_2_);
  }
  *pfVar5 = fVar19;
  return;
}

Assistant:

void LinearScore::calc_grad_ftrl(const SparseRow* row,
                                 Model& model,
                                 real_t pg,
                                 real_t norm) {
  // linear term
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id*3];
    real_t &wlg = w[feat_id*3+1];
    real_t &wlz = w[feat_id*3+2];
    real_t g = lambda_2_*wl+pg*iter->feat_val*sqrt_norm; 
    real_t old_wlg = wlg;
    wlg += g*g;
    real_t sigma = (sqrt(wlg)-sqrt(old_wlg)) / alpha_;
    wlz += (g-sigma*wl);
    int sign = wlz > 0 ? 1:-1;
    if (sign*wlz <= lambda_1_) {
      wl = 0;
    } else {
      wl = (sign*lambda_1_-wlz) / 
           ((beta_ + sqrt(wlg)) / 
            alpha_ + lambda_2_);
    }
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t &wbg = w[1];
  real_t &wbz = w[2];
  real_t g = pg;
  real_t old_wbg = wbg;
  wbg += g*g;
  real_t sigma = (sqrt(wbg)-sqrt(old_wbg)) / alpha_;
  wbz += (g-sigma*wb);
  int sign = wbz > 0 ? 1:-1;
  if (sign*wbz <= lambda_1_) {
    wb = 0;
  } else {
    wb = (sign*lambda_1_-wbz) / 
         ((beta_ + sqrt(wbg)) / 
          alpha_ + lambda_2_);
  }
}